

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log.c
# Opt level: O2

void fprint_timestamp(FILE *fd,char *file,int line,char *func,int priority,char *message,
                     char *appendix)

{
  tm *__tp;
  size_t sVar1;
  char *pcVar2;
  undefined4 in_register_00000084;
  time_t t;
  char buf [200];
  time_t local_100;
  char local_f8 [200];
  
  local_100 = time((time_t *)0x0);
  __tp = localtime(&local_100);
  if ((__tp != (tm *)0x0) && (sVar1 = strftime(local_f8,200,"%F %T",__tp), sVar1 != 0)) {
    if (message == (char *)0x0) {
      pcVar2 = "%s %s:%u %s(...) %s\n";
    }
    else {
      pcVar2 = "%s %s:%u %s(...) %s: %s\n";
    }
    fprintf((FILE *)fd,pcVar2,local_f8,file,(ulong)(uint)line,func,
            CONCAT44(in_register_00000084,priority));
    return;
  }
  if (message == (char *)0x0) {
    pcVar2 = "%s %s:%u %s(...) %s\n";
  }
  else {
    pcVar2 = "%s %s:%u %s(...) %s: %s\n";
  }
  fprintf((FILE *)fd,pcVar2 + 3,file,(ulong)(uint)line,func,CONCAT44(in_register_00000084,priority))
  ;
  return;
}

Assistant:

static void fprint_timestamp(
		FILE* fd,
		const char *file, int line, const char *func, int priority, const char *message, const char *appendix)
{
    struct tm * ptm;
    time_t t;
    char buf[200];

    t = time(NULL);
    ptm = localtime(&t);
    if (ptm == NULL || strftime(buf, sizeof(buf), "%F %T", ptm) == 0) {
        if (appendix)
            fprintf(fd, "%s:%u %s(...) %s: %s\n", file, line, func, message, appendix);
        else
            fprintf(fd, "%s:%u %s(...) %s\n", file, line, func, message);
    }
    else {
        if (appendix)
            fprintf(fd, "%s %s:%u %s(...) %s: %s\n", buf, file, line, func, message, appendix);
        else
            fprintf(fd, "%s %s:%u %s(...) %s\n", buf, file, line, func, message);
    }
}